

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O3

void __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::root_members_recursive_deletion
          (Simplex_tree<Gudhi::Simplex_tree_options_default> *this)

{
  Siblings *sib;
  stored_size_type sVar1;
  pointer ppVar2;
  pointer ppVar3;
  
  sVar1 = (this->root_).members_.m_flat_tree.m_data.m_seq.m_holder.m_size;
  if (sVar1 != 0) {
    ppVar2 = (this->root_).members_.m_flat_tree.m_data.m_seq.m_holder.m_start;
    ppVar3 = ppVar2;
    do {
      sib = (ppVar3->second).children_;
      if (sib->parent_ == ppVar3->first) {
        rec_delete(this,sib);
        ppVar2 = (this->root_).members_.m_flat_tree.m_data.m_seq.m_holder.m_start;
        sVar1 = (this->root_).members_.m_flat_tree.m_data.m_seq.m_holder.m_size;
      }
      ppVar3 = ppVar3 + 1;
    } while (ppVar3 != ppVar2 + sVar1);
  }
  (this->root_).members_.m_flat_tree.m_data.m_seq.m_holder.m_size = 0;
  return;
}

Assistant:

void root_members_recursive_deletion() {
    for (auto sh = root_.members().begin(); sh != root_.members().end(); ++sh) {
      if (has_children(sh)) {
        rec_delete(sh->second.children());
      }
    }
    root_.members().clear();
  }